

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockContextRemoveNode
               (ImGuiContext_conflict1 *ctx,ImGuiDockNode *node,bool merge_sibling_into_parent_node)

{
  ImGuiID key;
  bool bVar1;
  ImGuiDockNode *pIVar2;
  long lVar3;
  ImGuiDockNode *merge_lead_child;
  bool bVar4;
  
  key = node->ID;
  pIVar2 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,key);
  if (pIVar2 != node) {
    __assert_fail("DockContextFindNodeByID(ctx, node->ID) == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x32c3,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  if ((node->ChildNodes[0] != (ImGuiDockNode *)0x0) || (node->ChildNodes[1] != (ImGuiDockNode *)0x0)
     ) {
    __assert_fail("node->ChildNodes[0] == __null && node->ChildNodes[1] == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x32c4,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  if ((node->Windows).Size != 0) {
    __assert_fail("node->Windows.Size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x32c5,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  if (node->HostWindow != (ImGuiWindow_conflict *)0x0) {
    node->HostWindow->DockNodeAsHost = (ImGuiDockNode *)0x0;
  }
  pIVar2 = node->ParentNode;
  if (!merge_sibling_into_parent_node || pIVar2 == (ImGuiDockNode *)0x0) {
    if (pIVar2 != (ImGuiDockNode *)0x0) {
      lVar3 = 0;
      bVar4 = true;
      do {
        bVar1 = bVar4;
        if (pIVar2->ChildNodes[lVar3] == node) {
          node->ParentNode->ChildNodes[lVar3] = (ImGuiDockNode *)0x0;
        }
        lVar3 = 1;
        bVar4 = false;
      } while (bVar1);
    }
    ImGuiStorage::SetVoidPtr(&(ctx->DockContext).Nodes,key,(void *)0x0);
    IM_DELETE<ImGuiDockNode>(node);
    return;
  }
  merge_lead_child = pIVar2->ChildNodes[1];
  if ((pIVar2->ChildNodes[0] != node) &&
     (bVar4 = merge_lead_child != node, merge_lead_child = pIVar2->ChildNodes[0], bVar4)) {
    __assert_fail("parent_node->ChildNodes[0] == node || parent_node->ChildNodes[1] == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x32ce,"void ImGui::DockContextRemoveNode(ImGuiContext *, ImGuiDockNode *, bool)"
                 );
  }
  DockNodeTreeMerge(ctx,pIVar2,merge_lead_child);
  return;
}

Assistant:

static void ImGui::DockContextRemoveNode(ImGuiContext* ctx, ImGuiDockNode* node, bool merge_sibling_into_parent_node)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;

    IMGUI_DEBUG_LOG_DOCKING("DockContextRemoveNode 0x%08X\n", node->ID);
    IM_ASSERT(DockContextFindNodeByID(ctx, node->ID) == node);
    IM_ASSERT(node->ChildNodes[0] == NULL && node->ChildNodes[1] == NULL);
    IM_ASSERT(node->Windows.Size == 0);

    if (node->HostWindow)
        node->HostWindow->DockNodeAsHost = NULL;

    ImGuiDockNode* parent_node = node->ParentNode;
    const bool merge = (merge_sibling_into_parent_node && parent_node != NULL);
    if (merge)
    {
        IM_ASSERT(parent_node->ChildNodes[0] == node || parent_node->ChildNodes[1] == node);
        ImGuiDockNode* sibling_node = (parent_node->ChildNodes[0] == node ? parent_node->ChildNodes[1] : parent_node->ChildNodes[0]);
        DockNodeTreeMerge(&g, parent_node, sibling_node);
    }
    else
    {
        for (int n = 0; parent_node && n < IM_ARRAYSIZE(parent_node->ChildNodes); n++)
            if (parent_node->ChildNodes[n] == node)
                node->ParentNode->ChildNodes[n] = NULL;
        dc->Nodes.SetVoidPtr(node->ID, NULL);
        IM_DELETE(node);
    }
}